

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_inverse_scalar(secp256k1_scalar *out,secp256k1_scalar *x,int var)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  undefined4 uVar36;
  uint uVar37;
  int iVar38;
  uint extraout_EAX;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  code *pcVar58;
  code *pcVar59;
  uint extraout_XMM0_Da;
  uint uVar60;
  uint extraout_XMM0_Db;
  uint uVar62;
  uint extraout_XMM0_Dc;
  uint uVar63;
  undefined1 auVar61 [16];
  uint extraout_XMM0_Dd;
  uint uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  secp256k1_scalar l;
  secp256k1_scalar r;
  secp256k1_scalar t;
  uchar auStack_110 [32];
  secp256k1_fe *psStack_f0;
  secp256k1_fe *psStack_d8;
  code *pcStack_d0;
  code *local_c0;
  undefined1 local_b8 [32];
  secp256k1_fe local_98;
  undefined1 local_68 [16];
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  pcVar58 = secp256k1_scalar_inverse_var;
  if (var == 0) {
    pcVar58 = secp256k1_scalar_inverse;
  }
  r_00 = (secp256k1_fe *)local_b8;
  pcStack_d0 = (code *)0x156c60;
  r_01 = r_00;
  uVar36 = (*pcVar58)();
  if (out != (secp256k1_scalar *)0x0) {
    out->d[2] = CONCAT44(local_b8._20_4_,local_b8._16_4_);
    out->d[3] = CONCAT44(local_b8._28_4_,local_b8._24_4_);
    out->d[0] = CONCAT44(local_b8._4_4_,local_b8._0_4_);
    out->d[1] = CONCAT44(local_b8._12_4_,local_b8._8_4_);
  }
  uVar60 = 0;
  uVar62 = 0;
  uVar63 = 0;
  uVar64 = 0;
  auVar65._0_4_ = -(uint)((int)x->d[2] == 0 && (int)x->d[0] == 0);
  auVar65._4_4_ = -(uint)(*(int *)((long)x->d + 0x14) == 0 && *(int *)((long)x->d + 4) == 0);
  auVar65._8_4_ = -(uint)((int)x->d[3] == 0 && (int)x->d[1] == 0);
  auVar65._12_4_ = -(uint)(*(int *)((long)x->d + 0x1c) == 0 && *(int *)((long)x->d + 0xc) == 0);
  uVar37 = movmskps(uVar36,auVar65);
  uVar37 = uVar37 ^ 0xf;
  if (uVar37 != 0) {
    uVar40 = x->d[0];
    uVar41 = x->d[1];
    uVar1 = x->d[2];
    uVar47 = CONCAT44(local_b8._4_4_,local_b8._0_4_);
    uVar52 = CONCAT44(local_b8._12_4_,local_b8._8_4_);
    uVar35 = CONCAT44(local_b8._20_4_,local_b8._16_4_);
    out = (secp256k1_scalar *)CONCAT44(local_b8._28_4_,local_b8._24_4_);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar40;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar47;
    uVar42 = SUB168(auVar2 * auVar18,8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar42;
    local_98.n[0] = SUB168(auVar2 * auVar18,0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar40;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar52;
    auVar3 = auVar3 * auVar19;
    uVar48 = SUB168(auVar3 + auVar34,0);
    uVar50 = SUB168(auVar3 + auVar34,8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar41;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar47;
    uVar43 = SUB168(auVar4 * auVar20,8);
    uVar39 = SUB168(auVar4 * auVar20,0);
    local_98.n[1] = uVar48 + uVar39;
    uVar39 = (ulong)CARRY8(uVar48,uVar39);
    uVar48 = uVar50 + uVar43;
    uVar51 = uVar48 + uVar39;
    uVar53 = (ulong)CARRY8(auVar3._8_8_,(ulong)CARRY8(uVar42,auVar3._0_8_)) +
             (ulong)(CARRY8(uVar50,uVar43) || CARRY8(uVar48,uVar39));
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar40;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar35;
    uVar44 = SUB168(auVar5 * auVar21,8);
    uVar39 = SUB168(auVar5 * auVar21,0);
    uVar42 = uVar51 + uVar39;
    uVar39 = (ulong)CARRY8(uVar51,uVar39);
    uVar43 = uVar53 + uVar44;
    uVar54 = uVar43 + uVar39;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar41;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar52;
    uVar45 = SUB168(auVar6 * auVar22,8);
    uVar48 = SUB168(auVar6 * auVar22,0);
    uVar51 = uVar42 + uVar48;
    uVar48 = (ulong)CARRY8(uVar42,uVar48);
    uVar50 = uVar54 + uVar45;
    uVar55 = uVar50 + uVar48;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar1;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar47;
    uVar46 = SUB168(auVar7 * auVar23,8);
    uVar42 = SUB168(auVar7 * auVar23,0);
    local_98.n[2] = uVar51 + uVar42;
    uVar42 = (ulong)CARRY8(uVar51,uVar42);
    uVar51 = uVar55 + uVar46;
    uVar56 = uVar51 + uVar42;
    uVar54 = (ulong)(CARRY8(uVar53,uVar44) || CARRY8(uVar43,uVar39)) +
             (ulong)(CARRY8(uVar54,uVar45) || CARRY8(uVar50,uVar48)) +
             (ulong)(CARRY8(uVar55,uVar46) || CARRY8(uVar51,uVar42));
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar40;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = out;
    uVar44 = SUB168(auVar8 * auVar24,8);
    uVar40 = SUB168(auVar8 * auVar24,0);
    uVar48 = uVar56 + uVar40;
    uVar40 = (ulong)CARRY8(uVar56,uVar40);
    uVar43 = uVar54 + uVar44;
    uVar55 = uVar43 + uVar40;
    pcVar59 = (code *)x->d[3];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar41;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar35;
    uVar45 = SUB168(auVar9 * auVar25,8);
    uVar39 = SUB168(auVar9 * auVar25,0);
    uVar42 = uVar48 + uVar39;
    uVar39 = (ulong)CARRY8(uVar48,uVar39);
    uVar50 = uVar55 + uVar45;
    uVar56 = uVar50 + uVar39;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar1;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar52;
    uVar46 = SUB168(auVar10 * auVar26,8);
    uVar48 = SUB168(auVar10 * auVar26,0);
    uVar57 = uVar42 + uVar48;
    uVar48 = (ulong)CARRY8(uVar42,uVar48);
    uVar51 = uVar56 + uVar46;
    uVar49 = uVar51 + uVar48;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = pcVar59;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar47;
    uVar53 = SUB168(auVar11 * auVar27,8);
    uVar42 = SUB168(auVar11 * auVar27,0);
    local_98.n[3] = uVar57 + uVar42;
    uVar42 = (ulong)CARRY8(uVar57,uVar42);
    uVar47 = uVar49 + uVar53;
    uVar57 = uVar47 + uVar42;
    uVar44 = (ulong)(CARRY8(uVar54,uVar44) || CARRY8(uVar43,uVar40)) +
             (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar50,uVar39)) +
             (ulong)(CARRY8(uVar56,uVar46) || CARRY8(uVar51,uVar48)) +
             (ulong)(CARRY8(uVar49,uVar53) || CARRY8(uVar47,uVar42));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar41;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = out;
    uVar50 = SUB168(auVar12 * auVar28,8);
    uVar40 = SUB168(auVar12 * auVar28,0);
    uVar39 = uVar57 + uVar40;
    uVar40 = (ulong)CARRY8(uVar57,uVar40);
    uVar48 = uVar44 + uVar50;
    uVar45 = uVar48 + uVar40;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar35;
    uVar51 = SUB168(auVar13 * auVar29,8);
    uVar41 = SUB168(auVar13 * auVar29,0);
    uVar43 = uVar39 + uVar41;
    uVar41 = (ulong)CARRY8(uVar39,uVar41);
    uVar42 = uVar45 + uVar51;
    uVar46 = uVar42 + uVar41;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = pcVar59;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar52;
    uVar47 = SUB168(auVar14 * auVar30,8);
    uVar39 = SUB168(auVar14 * auVar30,0);
    local_98.n[4] = uVar43 + uVar39;
    uVar39 = (ulong)CARRY8(uVar43,uVar39);
    uVar43 = uVar46 + uVar47;
    uVar52 = uVar43 + uVar39;
    uVar43 = (ulong)(CARRY8(uVar44,uVar50) || CARRY8(uVar48,uVar40)) +
             (ulong)(CARRY8(uVar45,uVar51) || CARRY8(uVar42,uVar41)) +
             (ulong)(CARRY8(uVar46,uVar47) || CARRY8(uVar43,uVar39));
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar1;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = out;
    uVar48 = SUB168(auVar15 * auVar31,8);
    uVar40 = SUB168(auVar15 * auVar31,0);
    uVar39 = uVar52 + uVar40;
    uVar40 = (ulong)CARRY8(uVar52,uVar40);
    uVar1 = uVar43 + uVar48;
    uVar50 = uVar1 + uVar40;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar59;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar35;
    uVar42 = SUB168(auVar16 * auVar32,8);
    uVar41 = SUB168(auVar16 * auVar32,0);
    local_98._40_8_ = uVar39 + uVar41;
    uVar41 = (ulong)CARRY8(uVar39,uVar41);
    uVar39 = uVar50 + uVar42;
    local_68._8_8_ =
         (ulong)(CARRY8(uVar43,uVar48) || CARRY8(uVar1,uVar40)) +
         (ulong)(CARRY8(uVar50,uVar42) || CARRY8(uVar39,uVar41));
    local_68._0_8_ = uVar39 + uVar41;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = pcVar59;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = out;
    local_68 = auVar17 * auVar33 + local_68;
    r_00 = (secp256k1_fe *)&local_50;
    pcStack_d0 = (code *)0x156dfb;
    r_01 = r_00;
    local_c0 = pcVar58;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r_00,(uint64_t *)(local_b8 + 0x20));
    if (((local_50 != 1 || local_48 != 0) || local_40 != 0) || local_38 != 0) {
      pcStack_d0 = (code *)0x156ef2;
      test_inverse_scalar_cold_1();
      goto LAB_00156ef2;
    }
    pcStack_d0 = (code *)0x156e2b;
    iVar38 = secp256k1_scalar_add((secp256k1_scalar *)(local_b8 + 0x20),x,&scalar_minus_one);
    pcVar58 = local_c0;
    auVar61._0_4_ = -(uint)((int)local_98.n[2] == 0 && (int)local_98.n[0] == 0);
    auVar61._4_4_ = -(uint)(local_98.n[2]._4_4_ == 0 && local_98.n[0]._4_4_ == 0);
    auVar61._8_4_ = -(uint)((int)local_98.n[3] == 0 && (int)local_98.n[1] == 0);
    auVar61._12_4_ = -(uint)(local_98.n[3]._4_4_ == 0 && local_98.n[1]._4_4_ == 0);
    iVar38 = movmskps(iVar38,auVar61);
    if (iVar38 == 0xf) {
      return;
    }
    r_00 = (secp256k1_fe *)(local_b8 + 0x20);
    pcStack_d0 = (code *)0x156e5b;
    (*local_c0)(r_00,r_00);
    out = (secp256k1_scalar *)local_b8;
    pcStack_d0 = (code *)0x156e72;
    secp256k1_scalar_add(out,&scalar_minus_one,out);
    pcStack_d0 = (code *)0x156e7b;
    (*pcVar58)(out,out);
    pcStack_d0 = (code *)0x156e8d;
    secp256k1_scalar_add(out,out,&secp256k1_scalar_one);
    pcStack_d0 = (code *)0x156e9b;
    r_01 = (secp256k1_fe *)out;
    iVar38 = secp256k1_scalar_add(out,(secp256k1_scalar *)r_00,out);
    auVar66._0_4_ = -(uint)(local_b8._16_4_ == 0 && local_b8._0_4_ == 0);
    auVar66._4_4_ = -(uint)(local_b8._20_4_ == 0 && local_b8._4_4_ == 0);
    auVar66._8_4_ = -(uint)(local_b8._24_4_ == 0 && local_b8._8_4_ == 0);
    auVar66._12_4_ = -(uint)(local_b8._28_4_ == 0 && local_b8._12_4_ == 0);
    iVar38 = movmskps(iVar38,auVar66);
    if (iVar38 == 0xf) {
      return;
    }
    pcStack_d0 = (code *)0x156ebf;
    test_inverse_scalar_cold_2();
    uVar37 = extraout_EAX;
    uVar60 = extraout_XMM0_Da;
    uVar62 = extraout_XMM0_Db;
    uVar63 = extraout_XMM0_Dc;
    uVar64 = extraout_XMM0_Dd;
  }
  auVar67._0_4_ = -(uint)((local_b8._16_4_ | local_b8._0_4_) == uVar60);
  auVar67._4_4_ = -(uint)((local_b8._20_4_ | local_b8._4_4_) == uVar62);
  auVar67._8_4_ = -(uint)((local_b8._24_4_ | local_b8._8_4_) == uVar63);
  auVar67._12_4_ = -(uint)((local_b8._28_4_ | local_b8._12_4_) == uVar64);
  iVar38 = movmskps(uVar37,auVar67);
  pcVar59 = pcVar58;
  if (iVar38 == 0xf) {
    return;
  }
LAB_00156ef2:
  pcStack_d0 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_f0 = r_00;
  psStack_d8 = (secp256k1_fe *)out;
  pcStack_d0 = pcVar59;
  while( true ) {
    secp256k1_testrand256(auStack_110);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_110);
    if (((r_01->n[0] < 0xffffefffffc2f) || (r_01->n[4] != 0xffffffffffff)) ||
       ((r_01->n[2] & r_01->n[3] & r_01->n[1]) != 0xfffffffffffff)) break;
    r_01->magnitude = -1;
  }
  r_01->magnitude = 1;
  r_01->normalized = 1;
  secp256k1_fe_verify(r_01);
  return;
}

Assistant:

static void test_inverse_scalar(secp256k1_scalar* out, const secp256k1_scalar* x, int var)
{
    secp256k1_scalar l, r, t;

    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, x);  /* l = 1/x */
    if (out) *out = l;
    if (secp256k1_scalar_is_zero(x)) {
        CHECK(secp256k1_scalar_is_zero(&l));
        return;
    }
    secp256k1_scalar_mul(&t, x, &l);                                             /* t = x*(1/x) */
    CHECK(secp256k1_scalar_is_one(&t));                                          /* x*(1/x) == 1 */
    secp256k1_scalar_add(&r, x, &scalar_minus_one);                              /* r = x-1 */
    if (secp256k1_scalar_is_zero(&r)) return;
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&r, &r); /* r = 1/(x-1) */
    secp256k1_scalar_add(&l, &scalar_minus_one, &l);                             /* l = 1/x-1 */
    (var ? secp256k1_scalar_inverse_var : secp256k1_scalar_inverse)(&l, &l); /* l = 1/(1/x-1) */
    secp256k1_scalar_add(&l, &l, &secp256k1_scalar_one);                         /* l = 1/(1/x-1)+1 */
    secp256k1_scalar_add(&l, &r, &l);                                            /* l = 1/(1/x-1)+1 + 1/(x-1) */
    CHECK(secp256k1_scalar_is_zero(&l));                                         /* l == 0 */
}